

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall soul::heart::Parser::parseStructBody(Parser *this,Structure *s)

{
  bool bVar1;
  Structure *pSVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  string_view memberName;
  undefined1 local_178 [8];
  undefined1 uStack_170;
  undefined7 uStack_16f;
  StructurePtr local_168;
  undefined1 local_160 [8];
  Type type;
  CodeLocation typeLocation;
  Type local_130;
  Type structType;
  string name;
  string local_c0;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  while( true ) {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x2748be);
    if (bVar1) {
      return;
    }
    typeLocation.sourceCode.object =
         (this->
         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
         ).location.sourceCode.object;
    if (typeLocation.sourceCode.object != (SourceCodeText *)0x0) {
      ((typeLocation.sourceCode.object)->super_RefCountedObject).refCount =
           ((typeLocation.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    typeLocation.location.data =
         (this->
         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
         ).location.location.data;
    readValueType(&type,this);
    readGeneralIdentifier_abi_cxx11_(&name,this);
    expectSemicolon(this);
    memberName._M_str = name._M_dataplus._M_p;
    memberName._M_len = name._M_string_length;
    bVar1 = Structure::hasMemberWithName(s,memberName);
    if (bVar1) {
      Errors::nameInUse<std::__cxx11::string&>((CompileMessage *)&structType,(Errors *)&name,args);
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,(CompileMessage *)&structType);
      CompileMessage::~CompileMessage((CompileMessage *)&structType);
    }
    structType.category = structure;
    structType._9_7_ = 0;
    structType.arrayElementCategory = invalid;
    structType.isRef = false;
    structType.isConstant = false;
    structType.primitiveType.type = invalid;
    structType.boundingSize._0_1_ = 0;
    (s->super_RefCountedObject).refCount = (s->super_RefCountedObject).refCount + 1;
    structType.structure.object = s;
    bVar1 = Type::isEqual(&type,&structType,0);
    if (bVar1) break;
    if (type.category == structure) {
      Type::getStruct((Type *)local_160);
      pSVar2 = RefCountedPtr<soul::Structure>::operator->
                         ((RefCountedPtr<soul::Structure> *)local_160);
      local_178[0] = structure;
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_178 + 1);
      uStack_16f = 0;
      local_178[1] = invalid;
      local_178[2] = false;
      local_178[3] = false;
      local_178._4_4_ = invalid;
      uStack_170 = 0;
      (s->super_RefCountedObject).refCount = (s->super_RefCountedObject).refCount + 1;
      local_168.object = s;
      bVar1 = Structure::containsMemberOfType(pSVar2,(Type *)local_178,true);
      RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_168);
      RefCountedPtr<soul::Structure>::~RefCountedPtr((RefCountedPtr<soul::Structure> *)local_160);
      if (bVar1) {
        Type::getStruct((Type *)local_178);
        pSVar2 = RefCountedPtr<soul::Structure>::operator->
                           ((RefCountedPtr<soul::Structure> *)local_178);
        Errors::typesReferToEachOther<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  (&local_a0,(Errors *)&s->name,&pSVar2->name,args_1);
        CodeLocation::throwError(&typeLocation,&local_a0);
      }
    }
    local_130.boundingSize = type.boundingSize;
    local_130.arrayElementBoundingSize = type.arrayElementBoundingSize;
    local_130.structure.object = type.structure.object;
    if (type.structure.object != (Structure *)0x0) {
      ((type.structure.object)->super_RefCountedObject).refCount =
           ((type.structure.object)->super_RefCountedObject).refCount + 1;
    }
    std::__cxx11::string::string((string *)&local_c0,(string *)&name);
    Structure::addMember(s,&local_130,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_130.structure);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&structType.structure);
    std::__cxx11::string::~string((string *)&name);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&type.structure);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&typeLocation.sourceCode);
  }
  Errors::typeContainsItself<std::__cxx11::string_const&>(&local_68,(Errors *)&s->name,args_00);
  CodeLocation::throwError(&typeLocation,&local_68);
}

Assistant:

void parseStructBody (Structure& s)
    {
        while (! matchIf (HEARTOperator::closeBrace))
        {
            auto typeLocation = location;

            auto type = readValueType();
            auto name = readGeneralIdentifier();
            expectSemicolon();

            if (s.hasMemberWithName (name))
                throwError (Errors::nameInUse (name));

            auto structType = Type::createStruct (s);

            if (type.isEqual (structType, Type::failOnAllDifferences))
                typeLocation.throwError (Errors::typeContainsItself (s.getName()));

            if (type.isStruct() && type.getStruct()->containsMemberOfType (Type::createStruct (s), true))
                typeLocation.throwError (Errors::typesReferToEachOther (s.getName(), type.getStruct()->getName()));

            s.addMember (type, name);
        }
    }